

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

long duckdb::TryCastCInternal<duckdb::uhugeint_t,long,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  long in_RAX;
  bool in_R8B;
  uhugeint_t input;
  long result_value;
  long local_8;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (uint64_t)&local_8;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  local_8 = in_RAX;
  bVar2 = TryCast::Operation<duckdb::uhugeint_t,long>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(int64_t *)0x0,in_R8B);
  if (!bVar2) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}